

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

string_view __thiscall
bloaty::anon_unknown_0::ArFile::MemberReader::Consume(MemberReader *this,size_t n)

{
  char **ppcVar1;
  ulong __n;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  
  __n = ((uint)n & 1) + n;
  if (__n <= (this->remaining_)._M_len) {
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&this->remaining_,0,__n);
    ppcVar1 = &(this->remaining_)._M_str;
    *ppcVar1 = *ppcVar1 + __n;
    (this->remaining_)._M_len = (this->remaining_)._M_len - __n;
    sVar3._M_len = bVar2._M_len;
    sVar3._M_str = bVar2._M_str;
    return sVar3;
  }
  Throw("premature end of file",0x265);
}

Assistant:

string_view Consume(size_t n) {
      n = (n % 2 == 0 ? n : n + 1);
      if (remaining_.size() < n) {
        THROW("premature end of file");
      }
      string_view ret = remaining_.substr(0, n);
      remaining_.remove_prefix(n);
      return ret;
    }